

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.c
# Opt level: O1

int mbedtls_net_set_nonblock(mbedtls_net_context *ctx)

{
  uint uVar1;
  int iVar2;
  
  iVar2 = ctx->fd;
  uVar1 = fcntl(iVar2,3);
  iVar2 = fcntl(iVar2,4,(ulong)(uVar1 | 0x800));
  return iVar2;
}

Assistant:

int mbedtls_net_set_nonblock( mbedtls_net_context *ctx )
{
#if ( defined(_WIN32) || defined(_WIN32_WCE) ) && !defined(EFIX64) && \
    !defined(EFI32)
    u_long n = 1;
    return( ioctlsocket( ctx->fd, FIONBIO, &n ) );
#else
    return( fcntl( ctx->fd, F_SETFL, fcntl( ctx->fd, F_GETFL ) | O_NONBLOCK ) );
#endif
}